

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

path * __thiscall boost::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  char *begin;
  size_type sVar1;
  
  sVar1 = m_parent_path_end(this);
  if (sVar1 == 0xffffffffffffffff) {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  }
  else {
    begin = (this->m_pathname)._M_dataplus._M_p;
    path<char_const*>(__return_storage_ptr__,begin,begin + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::parent_path() const
  {
   size_type end_pos(m_parent_path_end());
   return end_pos == string_type::npos
     ? path()
     : path(m_pathname.c_str(), m_pathname.c_str() + end_pos);
  }